

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

void google::protobuf::compiler::objectivec::anon_unknown_0::
     CollectMinimalFileDepsContainingExtensionsWorker
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  bool bVar1;
  iterator iVar2;
  FileDescriptor *pFVar3;
  int i;
  int iVar4;
  FileDescriptor *local_28;
  
  local_28 = file;
  iVar2 = std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::find(&files_visited->_M_t,&local_28);
  if ((_Rb_tree_header *)iVar2._M_node == &(files_visited->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)files_visited,&local_28);
    pFVar3 = local_28;
    bVar1 = FileContainsExtensions(local_28);
    if (bVar1) {
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::push_back(files,&local_28);
      for (iVar4 = 0; iVar4 < *(int *)(local_28 + 0x20); iVar4 = iVar4 + 1) {
        pFVar3 = FileDescriptor::dependency(local_28,iVar4);
        PruneFileAndDepsMarkingAsVisited(pFVar3,files,files_visited);
      }
    }
    else {
      for (iVar4 = 0; iVar4 < *(int *)(pFVar3 + 0x20); iVar4 = iVar4 + 1) {
        pFVar3 = FileDescriptor::dependency(pFVar3,iVar4);
        CollectMinimalFileDepsContainingExtensionsWorker(pFVar3,files,files_visited);
        pFVar3 = local_28;
      }
    }
  }
  return;
}

Assistant:

void CollectMinimalFileDepsContainingExtensionsWorker(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files,
    std::set<const FileDescriptor*>* files_visited) {
  if (files_visited->find(file) != files_visited->end()) {
    return;
  }
  files_visited->insert(file);

  if (FileContainsExtensions(file)) {
    files->push_back(file);
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      PruneFileAndDepsMarkingAsVisited(dep, files, files_visited);
    }
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      CollectMinimalFileDepsContainingExtensionsWorker(dep, files,
                                                       files_visited);
    }
  }
}